

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_errmsg(sqlite3 *db)

{
  int iVar1;
  long in_RDI;
  char *z;
  sqlite3 *in_stack_ffffffffffffffe8;
  undefined8 local_8;
  
  if (in_RDI == 0) {
    local_8 = (uchar *)sqlite3ErrStr(7);
  }
  else {
    iVar1 = sqlite3SafetyCheckSickOrOk(in_stack_ffffffffffffffe8);
    if (iVar1 == 0) {
      iVar1 = sqlite3MisuseError(0);
      local_8 = (uchar *)sqlite3ErrStr(iVar1);
    }
    else {
      sqlite3_mutex_enter((sqlite3_mutex *)0x13a15a);
      if (*(char *)(in_RDI + 0x61) == '\0') {
        local_8 = sqlite3_value_text((sqlite3_value *)0x13a186);
        if (local_8 == (uchar *)0x0) {
          local_8 = (uchar *)sqlite3ErrStr(*(int *)(in_RDI + 0x50));
        }
      }
      else {
        local_8 = (uchar *)sqlite3ErrStr(7);
      }
      sqlite3_mutex_leave((sqlite3_mutex *)0x13a1b2);
    }
  }
  return (char *)local_8;
}

Assistant:

SQLITE_API const char *sqlite3_errmsg(sqlite3 *db){
  const char *z;
  if( !db ){
    return sqlite3ErrStr(SQLITE_NOMEM_BKPT);
  }
  if( !sqlite3SafetyCheckSickOrOk(db) ){
    return sqlite3ErrStr(SQLITE_MISUSE_BKPT);
  }
  sqlite3_mutex_enter(db->mutex);
  if( db->mallocFailed ){
    z = sqlite3ErrStr(SQLITE_NOMEM_BKPT);
  }else{
    testcase( db->pErr==0 );
    z = (char*)sqlite3_value_text(db->pErr);
    assert( !db->mallocFailed );
    if( z==0 ){
      z = sqlite3ErrStr(db->errCode);
    }
  }
  sqlite3_mutex_leave(db->mutex);
  return z;
}